

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_file.cpp
# Opt level: O0

bool __thiscall FileIO::Seek(FileIO *this,int32 pos,SeekMethod method)

{
  uint uVar1;
  int iVar2;
  int local_24;
  int origin;
  SeekMethod method_local;
  int32 pos_local;
  FileIO *this_local;
  
  uVar1 = GetFlags(this);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (method == begin) {
      local_24 = 0;
    }
    else if (method == current) {
      local_24 = 1;
    }
    else {
      if (method != end) {
        return false;
      }
      local_24 = 2;
    }
    iVar2 = fseek((FILE *)this->pfile,(long)pos,local_24);
    this_local._7_1_ = iVar2 != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool FileIO::Seek(int32 pos, SeekMethod method)
{
	if (!(GetFlags() & open))
		return false;

	int origin;
	switch (method)
	{
	case begin:
		origin = SEEK_SET;
		break;
	case current:
		origin = SEEK_CUR;
		break;
	case end:
		origin = SEEK_END;
		break;
	default:
		return false;
	}

	return (fseek(pfile, pos, origin) != 0);
}